

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void libdecorFrameHandleConfigure
               (libdecor_frame *frame,libdecor_configuration *config,void *userData)

{
  wl_proxy *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  _Bool _Var3;
  GLFWbool GVar4;
  uint32_t uVar5;
  libdecor_state *plVar6;
  uint maximized;
  uint uVar7;
  libdecor_window_state lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  int height;
  int width;
  libdecor_window_state windowState;
  int local_4c;
  int local_48;
  libdecor_window_state local_44;
  libdecor_frame *local_40;
  libdecor_configuration *local_38;
  
  local_40 = frame;
  _Var3 = (*_glfw.wl.libdecor.libdecor_configuration_get_window_state_)(config,&local_44);
  if (_Var3) {
    uVar7 = local_44 >> 2 & 1;
    lVar8 = local_44 & LIBDECOR_WINDOW_STATE_ACTIVE;
    maximized = local_44 >> 1 & 1;
  }
  else {
    uVar7 = *(uint *)((long)userData + 0x374);
    maximized = *(uint *)((long)userData + 0x36c);
    lVar8 = *(libdecor_window_state *)((long)userData + 0x370);
  }
  _Var3 = (*_glfw.wl.libdecor.libdecor_configuration_get_content_size_)
                    (config,local_40,&local_48,&local_4c);
  if (!_Var3) {
    local_48 = *(int *)((long)userData + 0x358);
    local_4c = *(int *)((long)userData + 0x35c);
  }
  if (((maximized == 0 && uVar7 == 0) && (*(int *)((long)userData + 0x78) != -1)) &&
     (*(int *)((long)userData + 0x7c) != -1)) {
    fVar11 = (float)local_48 / (float)local_4c;
    fVar10 = (float)*(int *)((long)userData + 0x78) / (float)*(int *)((long)userData + 0x7c);
    if (fVar10 <= fVar11) {
      if (fVar10 < fVar11) {
        local_48 = (int)(fVar10 * (float)local_4c);
      }
    }
    else {
      local_4c = (int)((float)local_48 / fVar10);
    }
  }
  local_38 = config;
  plVar6 = (*_glfw.wl.libdecor.libdecor_state_new_)(local_48,local_4c);
  (*_glfw.wl.libdecor.libdecor_frame_commit_)(local_40,plVar6,local_38);
  (*_glfw.wl.libdecor.libdecor_state_free_)(plVar6);
  if (((*(libdecor_window_state *)((long)userData + 0x370) != lVar8) &&
      (*(libdecor_window_state *)((long)userData + 0x370) = lVar8,
      lVar8 == LIBDECOR_WINDOW_STATE_NONE)) &&
     ((*(long *)((long)userData + 0x50) != 0 && (*(int *)((long)userData + 0x10) != 0)))) {
    (*_glfw.wl.libdecor.libdecor_frame_set_minimized_)(*(libdecor_frame **)((long)userData + 0x3d8))
    ;
  }
  if (*(uint *)((long)userData + 0x36c) != maximized) {
    *(uint *)((long)userData + 0x36c) = maximized;
    _glfwInputWindowMaximize((_GLFWwindow *)userData,maximized);
  }
  *(uint *)((long)userData + 0x374) = uVar7;
  bVar9 = *(int *)((long)userData + 0x368) == 0;
  if (bVar9) {
    *(undefined4 *)((long)userData + 0x368) = 1;
  }
  GVar4 = resizeWindow((_GLFWwindow *)userData,local_48,local_4c);
  if (GVar4 != 0) {
    _glfwInputWindowSize
              ((_GLFWwindow *)userData,*(int *)((long)userData + 0x358),
               *(int *)((long)userData + 0x35c));
  }
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  if (GVar4 != 0 || bVar9) {
    _glfwInputWindowDamage((_GLFWwindow *)userData);
  }
  else {
    pwVar1 = *(wl_proxy **)((long)userData + 0x388);
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
    (*p_Var2)(pwVar1,6,(wl_interface *)0x0,uVar5,0);
  }
  return;
}

Assistant:

void libdecorFrameHandleConfigure(struct libdecor_frame* frame,
                                  struct libdecor_configuration* config,
                                  void* userData)
{
    _GLFWwindow* window = userData;
    int width, height;

    enum libdecor_window_state windowState;
    GLFWbool fullscreen, activated, maximized;

    if (libdecor_configuration_get_window_state(config, &windowState))
    {
        fullscreen = (windowState & LIBDECOR_WINDOW_STATE_FULLSCREEN) != 0;
        activated = (windowState & LIBDECOR_WINDOW_STATE_ACTIVE) != 0;
        maximized = (windowState & LIBDECOR_WINDOW_STATE_MAXIMIZED) != 0;
    }
    else
    {
        fullscreen = window->wl.fullscreen;
        activated = window->wl.activated;
        maximized = window->wl.maximized;
    }

    if (!libdecor_configuration_get_content_size(config, frame, &width, &height))
    {
        width = window->wl.width;
        height = window->wl.height;
    }

    if (!maximized && !fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    struct libdecor_state* frameState = libdecor_state_new(width, height);
    libdecor_frame_commit(frame, frameState, config);
    libdecor_state_free(frameState);

    if (window->wl.activated != activated)
    {
        window->wl.activated = activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                libdecor_frame_set_minimized(window->wl.libdecor.frame);
        }
    }

    if (window->wl.maximized != maximized)
    {
        window->wl.maximized = maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = fullscreen;

    GLFWbool damaged = GLFW_FALSE;

    if (!window->wl.visible)
    {
        window->wl.visible = GLFW_TRUE;
        damaged = GLFW_TRUE;
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);
        damaged = GLFW_TRUE;
    }

    if (damaged)
        _glfwInputWindowDamage(window);
    else
        wl_surface_commit(window->wl.surface);
}